

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::RadioEntityType::RadioEntityType
          (RadioEntityType *this,KUINT8 Kind,KUINT8 Domain,KUINT8 Country,KUINT8 Categoy,
          KUINT8 NomenclatureVersion,KUINT16 Nomenclature)

{
  undefined3 in_register_00000009;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RadioEntityType_00225f08;
  this->m_ui8EntityKind = Kind;
  this->m_ui8Domain = Domain;
  this->m_ui16Country = (KUINT16)CONCAT31(in_register_00000009,Country);
  this->m_ui8Category = Categoy;
  this->m_ui8NomenclatureVersion = NomenclatureVersion;
  this->m_ui16Nomenclature = Nomenclature;
  return;
}

Assistant:

RadioEntityType::RadioEntityType( KUINT8 Kind, KUINT8  Domain, KUINT8 Country, KUINT8  Categoy,
                                  KUINT8  NomenclatureVersion, KUINT16 Nomenclature ) :
    m_ui8EntityKind( Kind ),
    m_ui8Domain( Domain ),
    m_ui16Country( Country ),
    m_ui8Category( Categoy ),
    m_ui8NomenclatureVersion( NomenclatureVersion ),
    m_ui16Nomenclature( Nomenclature )
{
}